

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_ls.c
# Opt level: O3

int CVodeSetLinearSolver(void *cvode_mem,SUNLinearSolver LS,SUNMatrix A)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  uint *__ptr;
  SUNLinearSolver_Ops p_Var4;
  long lVar5;
  long lVar6;
  SUNMatrix p_Var7;
  SUNMatrix p_Var8;
  int iVar9;
  int iVar10;
  char *pcVar11;
  bool bVar12;
  
  if (cvode_mem == (void *)0x0) {
    pcVar11 = "Integrator memory is NULL.";
    iVar9 = -1;
    cvode_mem = (CVodeMem)0x0;
    iVar10 = -1;
    iVar3 = 0x8c;
LAB_001272d5:
    cvProcessError((CVodeMem)cvode_mem,iVar10,iVar3,"CVodeSetLinearSolver",
                   "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_ls.c"
                   ,pcVar11);
    return iVar9;
  }
  if (LS == (SUNLinearSolver)0x0) {
    pcVar11 = "LS must be non-NULL";
    iVar9 = -3;
    cvode_mem = (CVodeMem)0x0;
    iVar10 = -3;
    iVar3 = 0x92;
    goto LAB_001272d5;
  }
  if ((LS->ops->gettype == (_func_SUNLinearSolver_Type_SUNLinearSolver *)0x0) ||
     (LS->ops->solve == (_func_int_SUNLinearSolver_SUNMatrix_N_Vector_N_Vector_sunrealtype *)0x0)) {
    pcVar11 = "LS object is missing a required operation";
    iVar9 = -3;
    iVar10 = -3;
    iVar3 = 0x9b;
    goto LAB_001272d5;
  }
  uVar2 = SUNLinSolGetType(LS);
  bVar12 = (uVar2 - 1 & 0xfffffffd) != 0;
  lVar5 = *(long *)(*(long *)((long)cvode_mem + 0x1d0) + 8);
  if ((*(long *)(lVar5 + 0x60) == 0) || (*(long *)(lVar5 + 0xa8) == 0)) {
    pcVar11 = "A required vector operation is not implemented.";
    iVar9 = -3;
    iVar10 = -3;
    iVar3 = 0xac;
    goto LAB_001272d5;
  }
  if (A != (SUNMatrix)0x0 && uVar2 == 3) {
    pcVar11 = "Incompatible inputs: matrix-embedded LS requires NULL matrix";
    iVar9 = -3;
    iVar10 = -3;
    iVar3 = 0xb4;
    goto LAB_001272d5;
  }
  if (uVar2 == 0) {
    if (A == (SUNMatrix)0x0) {
      pcVar11 = "Incompatible inputs: direct LS requires non-NULL matrix";
      iVar9 = -3;
      iVar10 = -3;
      iVar3 = 0xd4;
      goto LAB_001272d5;
    }
  }
  else {
    if (*(long *)(lVar5 + 0x48) == 0) {
      pcVar11 = "A required vector operation is not implemented.";
      iVar9 = -3;
      iVar10 = -3;
      iVar3 = 0xbe;
      goto LAB_001272d5;
    }
    if (((uVar2 != 3) != bVar12) &&
       (LS->ops->setatimes == (_func_SUNErrCode_SUNLinearSolver_void_ptr_SUNATimesFn *)0x0)) {
      pcVar11 = "Incompatible inputs: iterative LS must support ATimes routine";
      iVar9 = -3;
      iVar10 = -3;
      iVar3 = 0xc6;
      goto LAB_001272d5;
    }
    if ((A == (SUNMatrix)0x0) && ((uVar2 | 2) != 3)) {
      pcVar11 = "Incompatible inputs: matrix-iterative LS requires non-NULL matrix";
      iVar9 = -3;
      iVar10 = -3;
      iVar3 = 0xcd;
      goto LAB_001272d5;
    }
  }
  if (*(code **)((long)cvode_mem + 0x7d8) != (code *)0x0) {
    (**(code **)((long)cvode_mem + 0x7d8))(cvode_mem);
  }
  *(code **)((long)cvode_mem + 0x7c0) = cvLsInitialize;
  *(code **)((long)cvode_mem + 0x7c8) = cvLsSetup;
  *(code **)((long)cvode_mem + 2000) = cvLsSolve;
  *(code **)((long)cvode_mem + 0x7d8) = cvLsFree;
  __ptr = (uint *)calloc(1,0x140);
  if (__ptr == (uint *)0x0) {
    pcVar11 = "A memory request failed.";
    iVar9 = -4;
    iVar10 = -4;
    iVar3 = 0xe7;
    goto LAB_001272d5;
  }
  *(SUNLinearSolver *)(__ptr + 0x12) = LS;
  *__ptr = (uint)(uVar2 != 0);
  __ptr[1] = (uint)bVar12;
  p_Var7 = A;
  p_Var8 = A;
  if (A != (SUNMatrix)0x0) {
    p_Var7 = (SUNMatrix)cvLsDQJac;
    p_Var8 = (SUNMatrix)cvode_mem;
  }
  __ptr[2] = (uint)(A != (SUNMatrix)0x0);
  *(SUNMatrix *)(__ptr + 4) = p_Var7;
  *(SUNMatrix *)(__ptr + 6) = p_Var8;
  __ptr[0x3e] = 1;
  __ptr[0x40] = 0;
  __ptr[0x41] = 0;
  *(code **)(__ptr + 0x42) = cvLsDQJtimes;
  *(undefined8 *)(__ptr + 0x44) = *(undefined8 *)((long)cvode_mem + 0x10);
  *(void **)(__ptr + 0x46) = cvode_mem;
  __ptr[0x48] = 0;
  *(code **)(__ptr + 0x4a) = cvLsLinSys;
  *(void **)(__ptr + 0x4c) = cvode_mem;
  __ptr[0x36] = 0;
  __ptr[0x37] = 0;
  __ptr[0x38] = 0;
  __ptr[0x39] = 0;
  __ptr[0x3a] = 0;
  __ptr[0x3b] = 0;
  *(undefined8 *)(__ptr + 0x3c) = *(undefined8 *)((long)cvode_mem + 0x18);
  __ptr[0x22] = 0;
  __ptr[0x23] = 0;
  __ptr[0x24] = 0;
  __ptr[0x25] = 0;
  __ptr[0x26] = 0;
  __ptr[0x27] = 0;
  __ptr[0x28] = 0;
  __ptr[0x29] = 0;
  __ptr[0x2a] = 0;
  __ptr[0x2b] = 0;
  __ptr[0x2c] = 0;
  __ptr[0x2d] = 0;
  __ptr[0x2e] = 0;
  __ptr[0x2f] = 0;
  __ptr[0x30] = 0;
  __ptr[0x31] = 0;
  __ptr[0x32] = 0;
  __ptr[0x33] = 0;
  __ptr[0x20] = 0x33;
  __ptr[0x21] = 0;
  __ptr[8] = 1;
  __ptr[10] = 0x9999999a;
  __ptr[0xb] = 0x3fc99999;
  __ptr[0xe] = 0x9999999a;
  __ptr[0xf] = 0x3fa99999;
  __ptr[0x4e] = 0;
  p_Var4 = LS->ops;
  if (p_Var4->setatimes == (_func_SUNErrCode_SUNLinearSolver_void_ptr_SUNATimesFn *)0x0) {
LAB_001275a8:
    if ((p_Var4->setpreconditioner ==
         (_func_SUNErrCode_SUNLinearSolver_void_ptr_SUNPSetupFn_SUNPSolveFn *)0x0) ||
       (iVar3 = SUNLinSolSetPreconditioner(LS,cvode_mem,0,0), iVar3 == 0)) {
      if (A != (SUNMatrix)0x0) {
        *(SUNMatrix *)(__ptr + 0x14) = A;
        __ptr[0x16] = 0;
        __ptr[0x17] = 0;
      }
      lVar5 = N_VClone(*(undefined8 *)((long)cvode_mem + 0x1d0));
      *(long *)(__ptr + 0x18) = lVar5;
      if (lVar5 != 0) {
        lVar6 = N_VClone(*(undefined8 *)((long)cvode_mem + 0x1d0));
        *(long *)(__ptr + 0x1a) = lVar6;
        if (lVar6 == 0) {
          iVar9 = -4;
          cvProcessError((CVodeMem)cvode_mem,-4,0x14d,"CVodeSetLinearSolver",
                         "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_ls.c"
                         ,"A memory request failed.");
          N_VDestroy(lVar5);
          goto LAB_001276cf;
        }
        if (uVar2 == 0) {
LAB_0012772f:
          uVar2 = 1;
          if (*(int *)((long)cvode_mem + 0x20) == 2) goto LAB_0012773c;
        }
        else {
          lVar6 = N_VGetLength(lVar5);
          if (lVar6 < 1) {
            dVar1 = 0.0;
          }
          else {
            lVar5 = N_VGetLength(lVar5);
            dVar1 = (double)lVar5;
            if (dVar1 < 0.0) {
              dVar1 = sqrt(dVar1);
            }
            else {
              dVar1 = SQRT(dVar1);
            }
          }
          *(double *)(__ptr + 0x10) = dVar1;
          if ((uVar2 | 2) != 3) goto LAB_0012772f;
        }
        uVar2 = 0;
LAB_0012773c:
        __ptr[0xc] = uVar2;
        *(uint **)((long)cvode_mem + 0x7e0) = __ptr;
        return 0;
      }
      pcVar11 = "A memory request failed.";
      iVar9 = -4;
      iVar10 = -4;
      iVar3 = 0x143;
    }
    else {
      pcVar11 = "Error in calling SUNLinSolSetPreconditioner";
      iVar9 = -9;
      iVar10 = -9;
      iVar3 = 0x130;
    }
  }
  else {
    iVar3 = SUNLinSolSetATimes(LS,cvode_mem,cvLsATimes);
    if (iVar3 == 0) {
      p_Var4 = LS->ops;
      goto LAB_001275a8;
    }
    pcVar11 = "Error in calling SUNLinSolSetATimes";
    iVar9 = -9;
    iVar10 = -9;
    iVar3 = 0x122;
  }
  cvProcessError((CVodeMem)cvode_mem,iVar10,iVar3,"CVodeSetLinearSolver",
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_ls.c"
                 ,pcVar11);
LAB_001276cf:
  free(__ptr);
  return iVar9;
}

Assistant:

int CVodeSetLinearSolver(void* cvode_mem, SUNLinearSolver LS, SUNMatrix A)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  int retval, LSType;
  sunbooleantype iterative;   /* is the solver iterative?    */
  sunbooleantype matrixbased; /* is a matrix structure used? */

  /* Return immediately if either cvode_mem or LS inputs are NULL */
  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CVLS_MEM_NULL, __LINE__, __func__, __FILE__,
                   MSG_LS_CVMEM_NULL);
    return (CVLS_MEM_NULL);
  }
  if (LS == NULL)
  {
    cvProcessError(NULL, CVLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "LS must be non-NULL");
    return (CVLS_ILL_INPUT);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* Test if solver is compatible with LS interface */
  if ((LS->ops->gettype == NULL) || (LS->ops->solve == NULL))
  {
    cvProcessError(cv_mem, CVLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "LS object is missing a required operation");
    return (CVLS_ILL_INPUT);
  }

  /* Retrieve the LS type */
  LSType = SUNLinSolGetType(LS);

  /* Set flags based on LS type */
  iterative   = (LSType != SUNLINEARSOLVER_DIRECT);
  matrixbased = ((LSType != SUNLINEARSOLVER_ITERATIVE) &&
                 (LSType != SUNLINEARSOLVER_MATRIX_EMBEDDED));

  /* Test if vector is compatible with LS interface */
  if ((cv_mem->cv_tempv->ops->nvconst == NULL) ||
      (cv_mem->cv_tempv->ops->nvwrmsnorm == NULL))
  {
    cvProcessError(cv_mem, CVLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSG_LS_BAD_NVECTOR);
    return (CVLS_ILL_INPUT);
  }

  /* Ensure that A is NULL when LS is matrix-embedded */
  if ((LSType == SUNLINEARSOLVER_MATRIX_EMBEDDED) && (A != NULL))
  {
    cvProcessError(cv_mem, CVLS_ILL_INPUT, __LINE__, __func__,
                   __FILE__, "Incompatible inputs: matrix-embedded LS requires NULL matrix");
    return (CVLS_ILL_INPUT);
  }

  /* Check for compatible LS type, matrix and "atimes" support */
  if (iterative)
  {
    if (cv_mem->cv_tempv->ops->nvgetlength == NULL)
    {
      cvProcessError(cv_mem, CVLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                     MSG_LS_BAD_NVECTOR);
      return (CVLS_ILL_INPUT);
    }

    if (!matrixbased && (LSType != SUNLINEARSOLVER_MATRIX_EMBEDDED) &&
        (LS->ops->setatimes == NULL))
    {
      cvProcessError(cv_mem, CVLS_ILL_INPUT, __LINE__, __func__,
                     __FILE__, "Incompatible inputs: iterative LS must support ATimes routine");
      return (CVLS_ILL_INPUT);
    }

    if (matrixbased && (A == NULL))
    {
      cvProcessError(cv_mem, CVLS_ILL_INPUT, __LINE__, __func__,
                     __FILE__, "Incompatible inputs: matrix-iterative LS requires non-NULL matrix");
      return (CVLS_ILL_INPUT);
    }
  }
  else if (A == NULL)
  {
    cvProcessError(cv_mem, CVLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                   "Incompatible inputs: direct LS requires non-NULL matrix");
    return (CVLS_ILL_INPUT);
  }

  /* free any existing system solver attached to CVode */
  if (cv_mem->cv_lfree) { cv_mem->cv_lfree(cv_mem); }

  /* Set four main system linear solver function fields in cv_mem */
  cv_mem->cv_linit  = cvLsInitialize;
  cv_mem->cv_lsetup = cvLsSetup;
  cv_mem->cv_lsolve = cvLsSolve;
  cv_mem->cv_lfree  = cvLsFree;

  /* Allocate memory for CVLsMemRec */
  cvls_mem = NULL;
  cvls_mem = (CVLsMem)malloc(sizeof(struct CVLsMemRec));
  if (cvls_mem == NULL)
  {
    cvProcessError(cv_mem, CVLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSG_LS_MEM_FAIL);
    return (CVLS_MEM_FAIL);
  }
  memset(cvls_mem, 0, sizeof(struct CVLsMemRec));

  /* set SUNLinearSolver pointer */
  cvls_mem->LS = LS;

  /* Linear solver type information */
  cvls_mem->iterative   = iterative;
  cvls_mem->matrixbased = matrixbased;

  /* Set defaults for Jacobian-related fields */
  if (A != NULL)
  {
    cvls_mem->jacDQ  = SUNTRUE;
    cvls_mem->jac    = cvLsDQJac;
    cvls_mem->J_data = cv_mem;
  }
  else
  {
    cvls_mem->jacDQ  = SUNFALSE;
    cvls_mem->jac    = NULL;
    cvls_mem->J_data = NULL;
  }

  cvls_mem->jtimesDQ = SUNTRUE;
  cvls_mem->jtsetup  = NULL;
  cvls_mem->jtimes   = cvLsDQJtimes;
  cvls_mem->jt_f     = cv_mem->cv_f;
  cvls_mem->jt_data  = cv_mem;

  cvls_mem->user_linsys = SUNFALSE;
  cvls_mem->linsys      = cvLsLinSys;
  cvls_mem->A_data      = cv_mem;

  /* Set defaults for preconditioner-related fields */
  cvls_mem->pset   = NULL;
  cvls_mem->psolve = NULL;
  cvls_mem->pfree  = NULL;
  cvls_mem->P_data = cv_mem->cv_user_data;

  /* Initialize counters */
  cvLsInitializeCounters(cvls_mem);

  /* Set default values for the rest of the LS parameters */
  cvls_mem->msbj       = CVLS_MSBJ;
  cvls_mem->jbad       = SUNTRUE;
  cvls_mem->dgmax_jbad = CVLS_DGMAX;
  cvls_mem->eplifac    = CVLS_EPLIN;
  cvls_mem->last_flag  = CVLS_SUCCESS;

  /* If LS supports ATimes, attach CVLs routine */
  if (LS->ops->setatimes)
  {
    retval = SUNLinSolSetATimes(LS, cv_mem, cvLsATimes);
    if (retval != SUN_SUCCESS)
    {
      cvProcessError(cv_mem, CVLS_SUNLS_FAIL, __LINE__, __func__, __FILE__,
                     "Error in calling SUNLinSolSetATimes");
      free(cvls_mem);
      cvls_mem = NULL;
      return (CVLS_SUNLS_FAIL);
    }
  }

  /* If LS supports preconditioning, initialize pset/psol to NULL */
  if (LS->ops->setpreconditioner)
  {
    retval = SUNLinSolSetPreconditioner(LS, cv_mem, NULL, NULL);
    if (retval != SUN_SUCCESS)
    {
      cvProcessError(cv_mem, CVLS_SUNLS_FAIL, __LINE__, __func__, __FILE__,
                     "Error in calling SUNLinSolSetPreconditioner");
      free(cvls_mem);
      cvls_mem = NULL;
      return (CVLS_SUNLS_FAIL);
    }
  }

  /* When using a SUNMatrix object, store pointer to A and initialize savedJ */
  if (A != NULL)
  {
    cvls_mem->A      = A;
    cvls_mem->savedJ = NULL; /* allocated in cvLsInitialize */
  }

  /* Allocate memory for ytemp and x */
  cvls_mem->ytemp = N_VClone(cv_mem->cv_tempv);
  if (cvls_mem->ytemp == NULL)
  {
    cvProcessError(cv_mem, CVLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSG_LS_MEM_FAIL);
    free(cvls_mem);
    cvls_mem = NULL;
    return (CVLS_MEM_FAIL);
  }

  cvls_mem->x = N_VClone(cv_mem->cv_tempv);
  if (cvls_mem->x == NULL)
  {
    cvProcessError(cv_mem, CVLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSG_LS_MEM_FAIL);
    N_VDestroy(cvls_mem->ytemp);
    free(cvls_mem);
    cvls_mem = NULL;
    return (CVLS_MEM_FAIL);
  }

  /* For iterative LS, compute default norm conversion factor */
  if (iterative) { cvls_mem->nrmfac = SUNRsqrt(N_VGetLength(cvls_mem->ytemp)); }

  /* Check if solution scaling should be enabled */
  if (matrixbased && cv_mem->cv_lmm == CV_BDF) { cvls_mem->scalesol = SUNTRUE; }
  else { cvls_mem->scalesol = SUNFALSE; }

  /* Attach linear solver memory to integrator memory */
  cv_mem->cv_lmem = cvls_mem;

  return (CVLS_SUCCESS);
}